

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraCnf.c
# Opt level: O0

Vec_Ptr_t * Fra_CollectSuper(Aig_Obj_t *pObj,int fUseMuxes)

{
  int iVar1;
  Vec_Ptr_t *vSuper_00;
  Vec_Ptr_t *vSuper;
  int fUseMuxes_local;
  Aig_Obj_t *pObj_local;
  
  iVar1 = Aig_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraCnf.c"
                  ,0xc3,"Vec_Ptr_t *Fra_CollectSuper(Aig_Obj_t *, int)");
  }
  iVar1 = Aig_ObjIsCi(pObj);
  if (iVar1 == 0) {
    vSuper_00 = Vec_PtrAlloc(4);
    Fra_CollectSuper_rec(pObj,vSuper_00,1,fUseMuxes);
    return vSuper_00;
  }
  __assert_fail("!Aig_ObjIsCi(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraCnf.c"
                ,0xc4,"Vec_Ptr_t *Fra_CollectSuper(Aig_Obj_t *, int)");
}

Assistant:

Vec_Ptr_t * Fra_CollectSuper( Aig_Obj_t * pObj, int fUseMuxes )
{
    Vec_Ptr_t * vSuper;
    assert( !Aig_IsComplement(pObj) );
    assert( !Aig_ObjIsCi(pObj) );
    vSuper = Vec_PtrAlloc( 4 );
    Fra_CollectSuper_rec( pObj, vSuper, 1, fUseMuxes );
    return vSuper;
}